

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

void __thiscall
Lib::
BinaryHeap<Shell::BlockedClauseElimination::Candidate_*,_Shell::BlockedClauseElimination::CandidateComparator>
::expand(BinaryHeap<Shell::BlockedClauseElimination::Candidate_*,_Shell::BlockedClauseElimination::CandidateComparator>
         *this)

{
  uint uVar1;
  Candidate **ppCVar2;
  Candidate **ppCVar3;
  Candidate **ppCVar4;
  void **head;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = this->_capacity;
  ppCVar2 = this->_data;
  uVar6 = 4;
  if ((ulong)uVar1 != 0) {
    uVar6 = (ulong)(uVar1 * 2);
  }
  uVar5 = (uint)uVar6;
  this->_capacity = uVar5;
  if (uVar5 == 0) {
    ppCVar3 = (Candidate **)
              FixedSizeAllocator<8UL>::alloc
                        ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 3) {
    ppCVar3 = (Candidate **)
              FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 5) {
    ppCVar3 = (Candidate **)
              FixedSizeAllocator<32UL>::alloc
                        ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 7) {
    ppCVar3 = (Candidate **)
              FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 9) {
    ppCVar3 = (Candidate **)
              FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppCVar3 = (Candidate **)::operator_new(uVar6 << 3,0x10);
  }
  this->_data = ppCVar3;
  this->_data1 = ppCVar3 + -1;
  uVar6 = (ulong)this->_size;
  if (uVar6 != 0) {
    ppCVar3 = ppCVar3 + uVar6;
    ppCVar4 = ppCVar2 + uVar6;
    do {
      ppCVar4 = ppCVar4 + -1;
      ppCVar3[-1] = *ppCVar4;
      ppCVar3 = ppCVar3 + -1;
    } while (ppCVar3 != this->_data);
  }
  if (ppCVar2 != (Candidate **)0x0) {
    uVar6 = (ulong)uVar1 * 8 + 0xf & 0xffffffff0;
    if (uVar6 == 0) {
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar2;
    }
    else if (uVar6 < 0x11) {
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar2;
    }
    else if (uVar6 < 0x19) {
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar2;
    }
    else if (uVar6 < 0x21) {
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar2;
    }
    else if (uVar6 < 0x31) {
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar2;
    }
    else {
      if (0x40 < uVar6) {
        operator_delete(ppCVar2,0x10);
        return;
      }
      *ppCVar2 = (Candidate *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar2;
    }
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }